

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.cpp
# Opt level: O3

int64_t npas4::GetRAMSystemUsed(void)

{
  sysinfo memInfo;
  sysinfo sStack_78;
  
  sysinfo(&sStack_78);
  return (ulong)sStack_78.mem_unit *
         ((sStack_78.totalhigh + sStack_78.totalswap + sStack_78.totalram) -
         (sStack_78.freehigh + sStack_78.freeswap + sStack_78.freeram));
}

Assistant:

int64_t npas4::GetRAMSystemUsed()
{
#ifdef WIN32
	return npas4::GetRAMSystemTotal() - npas4::GetRAMSystemAvailable();
#else
	struct sysinfo memInfo;
	sysinfo(&memInfo);
	int64_t total = memInfo.totalram - memInfo.freeram;
	total += memInfo.totalswap - memInfo.freeswap;
	total += memInfo.totalhigh - memInfo.freehigh;
	return total * static_cast<int64_t>(memInfo.mem_unit);
#endif
}